

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

void class_addcreator(t_newmethod newmethod,t_symbol *s,t_atomtype type1,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  long lVar2;
  t_atomtype *ptVar3;
  ulong uVar4;
  t_atomtype *ptVar5;
  t_atomtype tVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  t_atomtype vec [6];
  va_list ap;
  t_atomtype local_d8 [6];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  ptVar3 = (t_atomtype *)&stack0x00000008;
  uVar1 = 0x18;
  lVar2 = 1;
  tVar6 = type1;
  do {
    vec[0] = type1;
    if (tVar6 == A_NULL) {
LAB_0016687d:
      class_addmethod(pd_objectmaker,(t_method)newmethod,s,type1,(ulong)vec[1],(ulong)vec[2],
                      (ulong)vec[3],(ulong)vec[4],(ulong)vec[5]);
      return;
    }
    if ((int)lVar2 == 6) {
      if (s == (t_symbol *)0x0) {
        pd_error((void *)0x0,"unnamed class: sorry: only %d creation args allowed",5);
      }
      else {
        pd_error((void *)0x0,"class %s: sorry: only %d creation args allowed",s->s_name,5);
      }
      goto LAB_0016687d;
    }
    if (uVar1 < 0x29) {
      uVar4 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      ptVar5 = (t_atomtype *)((long)local_d8 + uVar4);
    }
    else {
      ptVar5 = ptVar3;
      ptVar3 = ptVar3 + 2;
    }
    tVar6 = *ptVar5;
    vec[lVar2] = tVar6;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void class_addcreator(t_newmethod newmethod, t_symbol *s,
    t_atomtype type1, ...)
{
    va_list ap;
    t_atomtype vec[MAXPDARG+1], *vp = vec;
    int count = 0;
    *vp = type1;

    va_start(ap, type1);
    while (*vp)
    {
        if (count == MAXPDARG)
        {
            if(s)
                pd_error(0, "class %s: sorry: only %d creation args allowed",
                      s->s_name, MAXPDARG);
            else
                pd_error(0, "unnamed class: sorry: only %d creation args allowed",
                      MAXPDARG);
            break;
        }
        vp++;
        count++;
        *vp = va_arg(ap, t_atomtype);
    }
    va_end(ap);
    class_addmethod(pd_objectmaker, (t_method)newmethod, s,
        vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
}